

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_dimensionlessScalingFactor_Test::~Units_dimensionlessScalingFactor_Test
          (Units_dimensionlessScalingFactor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, dimensionlessScalingFactor)
{
    auto m = libcellml::Model::create("model");
    auto u = libcellml::Units::create("u");

    auto u1 = libcellml::Units::create("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0);
    u1->addUnit("dimensionless");
    auto u2 = libcellml::Units::create("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001);
    u2->addUnit("dimensionless");

    auto u3 = libcellml::Units::create("u3");
    u3->addUnit("u", "milli", 2.0, 1000.0);
    auto u4 = libcellml::Units::create("u4");
    u4->addUnit("u", "kilo", 2.0, 0.001);

    auto u5 = libcellml::Units::create("u5");
    u5->addUnit("u", "milli", 2.0, 1000.0);
    u5->addUnit("dimensionless", 2.0);
    auto u6 = libcellml::Units::create("u6");
    u6->addUnit("u", "kilo", 2.0, 0.001);
    u6->addUnit("dimensionless", 2.0);

    m->addUnits(u);
    m->addUnits(u1);
    m->addUnits(u2);
    m->addUnits(u3);
    m->addUnits(u4);
    m->addUnits(u5);
    m->addUnits(u6);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u2, u1));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u3, u4));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u4, u3));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u3));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u2, u4));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u4));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u2, u3));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u5, u6));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u6, u5));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u5));
}